

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hostkey.c
# Opt level: O0

int test(LIBSSH2_SESSION *session)

{
  char *src;
  char *src_00;
  char *src_01;
  LIBSSH2_SESSION *session_00;
  int iVar1;
  char *__s1;
  size_t sVar2;
  char *hostkey;
  char *expected_hostkey;
  size_t expected_len;
  char *pcStack_28;
  int type;
  size_t len;
  LIBSSH2_SESSION *pLStack_18;
  int rc;
  LIBSSH2_SESSION *session_local;
  
  expected_hostkey = (char *)0x0;
  hostkey = (char *)0x0;
  pLStack_18 = session;
  __s1 = libssh2_session_hostkey
                   (session,(size_t *)&stack0xffffffffffffffd8,(int *)((long)&expected_len + 4));
  session_00 = pLStack_18;
  src_01 = EXPECTED_RSA_HOSTKEY;
  src_00 = EXPECTED_ECDSA_HOSTKEY;
  src = EXPECTED_ED25519_HOSTKEY;
  if (__s1 == (char *)0x0) {
    print_last_session_error("libssh2_session_hostkey");
    session_local._4_4_ = 1;
  }
  else {
    if (expected_len._4_4_ == 6) {
      sVar2 = strlen(EXPECTED_ED25519_HOSTKEY);
      len._4_4_ = _libssh2_base64_decode(session_00,&hostkey,(size_t *)&expected_hostkey,src,sVar2);
    }
    else if (expected_len._4_4_ == 3) {
      sVar2 = strlen(EXPECTED_ECDSA_HOSTKEY);
      len._4_4_ = _libssh2_base64_decode
                            (session_00,&hostkey,(size_t *)&expected_hostkey,src_00,sVar2);
    }
    else {
      if (expected_len._4_4_ != 1) {
        fprintf(_stderr,"Unexpected type of hostkey: %i\n",(ulong)expected_len._4_4_);
        return 1;
      }
      sVar2 = strlen(EXPECTED_RSA_HOSTKEY);
      len._4_4_ = _libssh2_base64_decode
                            (session_00,&hostkey,(size_t *)&expected_hostkey,src_01,sVar2);
    }
    if (len._4_4_ == 0) {
      if (pcStack_28 == expected_hostkey) {
        iVar1 = memcmp(__s1,hostkey,(size_t)pcStack_28);
        if (iVar1 == 0) {
          session_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"Hostkeys do not match\n");
          session_local._4_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"Hostkey does not have the expected length %ld!=%ld\n",pcStack_28,
                expected_hostkey);
        session_local._4_4_ = 1;
      }
    }
    else {
      print_last_session_error("_libssh2_base64_decode");
      session_local._4_4_ = 1;
    }
  }
  return session_local._4_4_;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    int rc;
    size_t len;
    int type;
    size_t expected_len = 0;
    char *expected_hostkey = NULL;

    const char *hostkey = libssh2_session_hostkey(session, &len, &type);
    if(!hostkey) {
        print_last_session_error("libssh2_session_hostkey");
        return 1;
    }

    if(type == LIBSSH2_HOSTKEY_TYPE_ED25519) {
        rc = _libssh2_base64_decode(session, &expected_hostkey, &expected_len,
                                    EXPECTED_ED25519_HOSTKEY,
                                    strlen(EXPECTED_ED25519_HOSTKEY));
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_ECDSA_256) {
        rc = _libssh2_base64_decode(session, &expected_hostkey, &expected_len,
                                    EXPECTED_ECDSA_HOSTKEY,
                                    strlen(EXPECTED_ECDSA_HOSTKEY));
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_RSA) {
        rc = _libssh2_base64_decode(session, &expected_hostkey, &expected_len,
                                    EXPECTED_RSA_HOSTKEY,
                                    strlen(EXPECTED_RSA_HOSTKEY));
    }
    else {
        fprintf(stderr, "Unexpected type of hostkey: %i\n", type);
        return 1;
    }

    if(rc) {
        print_last_session_error("_libssh2_base64_decode");
        return 1;
    }

    if(len != expected_len) {
        fprintf(stderr, "Hostkey does not have the expected length %ld!=%ld\n",
                (unsigned long)len, (unsigned long)expected_len);
        return 1;
    }

    if(memcmp(hostkey, expected_hostkey, len) != 0) {
        fprintf(stderr, "Hostkeys do not match\n");
        return 1;
    }

    return 0;
}